

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::Reflection::UnsafeArenaReleaseMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  Message *pMVar1;
  FieldDescriptor FVar2;
  int iVar3;
  uint32_t uVar4;
  MessageLite *pMVar5;
  LogMessage *pLVar6;
  long lVar7;
  FieldDescriptor *local_68;
  LogMessage local_60;
  
  if (*(Descriptor **)(field + 0x20) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseMessage","Field does not match message type.");
  }
  if ((~(byte)field[1] & 0x60) == 0) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseMessage",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_60._0_8_ = FieldDescriptor::TypeOnceInit;
    local_68 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_60,&local_68)
    ;
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"ReleaseMessage",CPPTYPE_MESSAGE);
  }
  FVar2 = field[1];
  if (((byte)FVar2 & 8) != 0) {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    uVar4 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    pMVar5 = internal::ExtensionSet::UnsafeArenaReleaseMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),field
                        ,factory);
    return (Message *)pMVar5;
  }
  if (((~(byte)FVar2 & 0x60) != 0) &&
     ((lVar7 = *(long *)(field + 0x28), lVar7 == 0 || ((byte)FVar2 & 0x10) == 0 ||
      ((*(int *)(lVar7 + 4) == 1 && ((*(byte *)(*(long *)(lVar7 + 0x20) + 1) & 2) != 0)))))) {
    ClearBit(this,message,field);
    FVar2 = field[1];
  }
  lVar7 = *(long *)(field + 0x28);
  if (lVar7 != 0 && ((byte)FVar2 & 0x10) != 0) {
    if (*(int *)(lVar7 + 4) == 1) {
      if ((*(byte *)(*(long *)(lVar7 + 0x20) + 1) & 2) != 0) goto LAB_00395e34;
      if ((*(byte *)(*(long *)(lVar7 + 0x20) + 1) & 2) != 0) {
        internal::LogMessage::LogMessage
                  (&local_60,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.h"
                   ,0x5b7);
        pLVar6 = internal::LogMessage::operator<<
                           (&local_60,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_68,pLVar6);
        internal::LogMessage::~LogMessage(&local_60);
      }
    }
    iVar3 = (this->schema_).oneof_case_offset_;
    if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)(lVar7 - *(long *)(*(long *)(lVar7 + 0x10) + 0x30)) >> 3)
                              * 0x33333334 + iVar3)) != *(int *)(field + 4)) {
      return (Message *)0x0;
    }
    if (((byte)field[1] & 0x10) == 0) {
      lVar7 = 0;
    }
    else {
      lVar7 = *(long *)(field + 0x28);
    }
    if ((*(int *)(lVar7 + 4) == 1) && ((*(byte *)(*(long *)(lVar7 + 0x20) + 1) & 2) != 0)) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x97b);
      pLVar6 = internal::LogMessage::operator<<
                         (&local_60,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_68,pLVar6);
      internal::LogMessage::~LogMessage(&local_60);
      iVar3 = (this->schema_).oneof_case_offset_;
    }
    *(undefined4 *)
     ((long)&(message->super_MessageLite)._vptr_MessageLite +
     (ulong)(uint)((int)((ulong)(lVar7 - *(long *)(*(long *)(lVar7 + 0x10) + 0x30)) >> 3) *
                   0x33333334 + iVar3)) = 0;
  }
LAB_00395e34:
  uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
  pMVar1 = *(Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
  *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) = 0;
  return pMVar1;
}

Assistant:

Message* Reflection::UnsafeArenaReleaseMessage(Message* message,
                                               const FieldDescriptor* field,
                                               MessageFactory* factory) const {
  USAGE_CHECK_ALL(ReleaseMessage, SINGULAR, MESSAGE);
  CheckInvalidAccess(schema_, field);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->UnsafeArenaReleaseMessage(field,
                                                                factory));
  } else {
    if (!(field->is_repeated() || schema_.InRealOneof(field))) {
      ClearBit(message, field);
    }
    if (schema_.InRealOneof(field)) {
      if (HasOneofField(*message, field)) {
        *MutableOneofCase(message, field->containing_oneof()) = 0;
      } else {
        return nullptr;
      }
    }
    Message** result = MutableRaw<Message*>(message, field);
    Message* ret = *result;
    *result = nullptr;
    return ret;
  }
}